

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fst.h
# Opt level: O0

void __thiscall
PDA::Transducer::BasicFst<wchar_t>::Vertex::
Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
          (Vertex *this,pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *first,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_1)

{
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local_1;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *first_local;
  Vertex *this_local;
  
  std::__cxx11::
  list<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>,_std::allocator<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>_>_>
  ::list(&this->m_transitions);
  std::function<void_()>::function(&this->m_action);
  addTransition<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (this,first,rest,rest_1);
  return;
}

Assistant:

Vertex (const First &first, const Rest&... rest)
        {
            addTransition(first, rest...);
        }